

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TupleOptimization.cpp
# Opt level: O0

void __thiscall wasm::TupleOptimization::optimize(TupleOptimization *this,Function *func)

{
  size_t *this_00;
  uint uVar1;
  bool bVar2;
  Index IVar3;
  _Bit_pointer puVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  reference this_01;
  reference puVar8;
  size_t sVar9;
  mapped_type *pmVar10;
  Type *pTVar11;
  Module *module;
  reference rVar12;
  Iterator IVar13;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar14;
  byte local_3b1;
  undefined1 local_348 [8];
  MapApplier mapApplier;
  Index newIndex;
  Type t;
  Iterator __end3_1;
  Iterator __begin3_1;
  Type *__range3_1;
  mapped_type mStack_1e0;
  Index lastNewIndex;
  size_t newBase;
  _Bit_type local_1d0;
  key_type local_1c4;
  undefined1 local_1c0 [4];
  Index i_3;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  tupleToNewBaseMap;
  reference local_180;
  reference local_170;
  uint local_160;
  byte local_15a;
  allocator<bool> local_159;
  Index i_2;
  bool hasGood;
  vector<bool,_std::allocator<bool>_> good;
  _Node_iterator_base<unsigned_int,_false> _Stack_128;
  uint target;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  _Bit_type local_108;
  reference local_100;
  uint local_f0;
  uint local_ec;
  uint i_1;
  Index i;
  UniqueDeferredQueue<unsigned_int> work;
  allocator<bool> local_49;
  undefined1 local_48 [8];
  vector<bool,_std::allocator<bool>_> bad;
  size_t numLocals;
  Function *func_local;
  TupleOptimization *this_local;
  
  puVar4 = (_Bit_pointer)Function::getNumLocals(func);
  bad.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
       = puVar4;
  std::allocator<bool>::allocator(&local_49);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_48,(size_type)puVar4,&local_49);
  std::allocator<bool>::~allocator(&local_49);
  UniqueDeferredQueue<unsigned_int>::UniqueDeferredQueue((UniqueDeferredQueue<unsigned_int> *)&i_1);
  local_ec = 0;
  while( true ) {
    uVar5 = (ulong)local_ec;
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->uses);
    if (sVar6 <= uVar5) {
      while( true ) {
        bVar2 = UniqueDeferredQueue<unsigned_int>::empty((UniqueDeferredQueue<unsigned_int> *)&i_1);
        puVar4 = bad.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                 _M_end_of_storage;
        if (((bVar2 ^ 0xffU) & 1) == 0) break;
        local_f0 = UniqueDeferredQueue<unsigned_int>::pop((UniqueDeferredQueue<unsigned_int> *)&i_1)
        ;
        rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_48,(ulong)local_f0);
        local_100 = rVar12;
        bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_100);
        if (!bVar2) {
          rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)local_48,(ulong)local_f0);
          local_108 = rVar12._M_mask;
          __range3 = (value_type *)rVar12._M_p;
          std::_Bit_reference::operator=((_Bit_reference *)&__range3,true);
          this_01 = std::
                    vector<std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                    ::operator[](&this->copiedIndexes,(ulong)local_f0);
          __end3 = std::
                   unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::begin(this_01);
          _Stack_128._M_cur =
               (__node_type *)
               std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::end(this_01);
          while( true ) {
            bVar2 = std::__detail::operator!=
                              (&__end3.super__Node_iterator_base<unsigned_int,_false>,
                               &stack0xfffffffffffffed8);
            if (!bVar2) break;
            puVar8 = std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*(&__end3);
            good.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage._4_4_ = *puVar8;
            UniqueDeferredQueue<unsigned_int>::push
                      ((UniqueDeferredQueue<unsigned_int> *)&i_1,
                       good.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage._4_4_);
            std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end3);
          }
        }
      }
      std::allocator<bool>::allocator(&local_159);
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)&i_2,(size_type)puVar4,&local_159);
      std::allocator<bool>::~allocator(&local_159);
      local_15a = 0;
      local_160 = 0;
      while( true ) {
        uVar5 = (ulong)local_160;
        sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->uses);
        if (sVar6 <= uVar5) break;
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->uses,(ulong)local_160);
        local_3b1 = 0;
        if (*pvVar7 != 0) {
          rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)local_48,(ulong)local_160);
          local_170 = rVar12;
          bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_170);
          local_3b1 = bVar2 ^ 0xff;
        }
        if ((local_3b1 & 1) != 0) {
          rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)&i_2,(ulong)local_160);
          local_180 = rVar12;
          std::_Bit_reference::operator=(&local_180,true);
          local_15a = 1;
        }
        local_160 = local_160 + 1;
      }
      if ((local_15a & 1) == 0) {
        tupleToNewBaseMap._M_h._M_single_bucket._4_4_ = 1;
      }
      else {
        std::
        unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
        ::unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                         *)local_1c0);
        local_1c4 = 0;
        while( true ) {
          uVar5 = (ulong)local_1c4;
          sVar6 = std::vector<bool,_std::allocator<bool>_>::size
                            ((vector<bool,_std::allocator<bool>_> *)&i_2);
          if (sVar6 <= uVar5) break;
          rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)&i_2,(ulong)local_1c4);
          local_1d0 = rVar12._M_mask;
          newBase = (size_t)rVar12._M_p;
          bVar2 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&newBase);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            sVar9 = Function::getNumLocals(func);
            mStack_1e0 = (mapped_type)sVar9;
            pmVar10 = std::
                      unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                      ::operator[]((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                    *)local_1c0,&local_1c4);
            *pmVar10 = mStack_1e0;
            __range3_1._4_4_ = 0;
            __begin3_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
                 (size_t)Function::getLocalType(func,local_1c4);
            this_00 = &__begin3_1.
                       super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
            IVar13 = wasm::Type::begin((Type *)this_00);
            __begin3_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                 (Type *)IVar13.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                         index;
            __end3_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
                 (size_t)IVar13.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                         parent;
            PVar14 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                     wasm::Type::end((Type *)this_00);
            while( true ) {
              __end3_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                   (Type *)PVar14.index;
              t.id = (uintptr_t)PVar14.parent;
              bVar2 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                                ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                                 &__end3_1.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                  .index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                          *)&t);
              if (!bVar2) break;
              pTVar11 = wasm::Type::Iterator::operator*
                                  ((Iterator *)
                                   &__end3_1.
                                    super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                    .index);
              mapApplier.replacedTees._M_h._M_single_bucket = (__node_base_ptr)pTVar11->id;
              IVar3 = Builder::addVar(func,(Type)mapApplier.replacedTees._M_h._M_single_bucket);
              if (__range3_1._4_4_ == 0) {
                if (IVar3 != sVar9) {
                  __assert_fail("newIndex == newBase",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/TupleOptimization.cpp"
                                ,0xde,"void wasm::TupleOptimization::optimize(Function *)");
                }
              }
              else if (IVar3 != __range3_1._4_4_ + 1) {
                __assert_fail("newIndex == lastNewIndex + 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/TupleOptimization.cpp"
                              ,0xe1,"void wasm::TupleOptimization::optimize(Function *)");
              }
              ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                        ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                         &__end3_1.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index)
              ;
              PVar14.index = (size_t)__end3_1.
                                     super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                     .parent;
              PVar14.parent = (Type *)t.id;
              __range3_1._4_4_ = IVar3;
            }
          }
          local_1c4 = local_1c4 + 1;
        }
        MapApplier::MapApplier
                  ((MapApplier *)local_348,
                   (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    *)local_1c0);
        module = Walker<wasm::TupleOptimization,_wasm::Visitor<wasm::TupleOptimization,_void>_>::
                 getModule(&(this->
                            super_WalkerPass<wasm::PostWalker<wasm::TupleOptimization,_wasm::Visitor<wasm::TupleOptimization,_void>_>_>
                            ).
                            super_PostWalker<wasm::TupleOptimization,_wasm::Visitor<wasm::TupleOptimization,_void>_>
                            .
                            super_Walker<wasm::TupleOptimization,_wasm::Visitor<wasm::TupleOptimization,_void>_>
                          );
        Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
        ::walkFunctionInModule
                  ((Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
                    *)local_348,func,module);
        MapApplier::~MapApplier((MapApplier *)local_348);
        std::
        unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
        ::~unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                          *)local_1c0);
        tupleToNewBaseMap._M_h._M_single_bucket._4_4_ = 0;
      }
      std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)&i_2)
      ;
      UniqueDeferredQueue<unsigned_int>::~UniqueDeferredQueue
                ((UniqueDeferredQueue<unsigned_int> *)&i_1);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_48);
      return;
    }
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->validUses,(ulong)local_ec);
    uVar1 = *pvVar7;
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->uses,(ulong)local_ec);
    if (*pvVar7 < uVar1) break;
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->uses,(ulong)local_ec);
    if (*pvVar7 != 0) {
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->validUses,(ulong)local_ec);
      uVar1 = *pvVar7;
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->uses,(ulong)local_ec);
      if (uVar1 < *pvVar7) {
        UniqueDeferredQueue<unsigned_int>::push((UniqueDeferredQueue<unsigned_int> *)&i_1,local_ec);
      }
    }
    local_ec = local_ec + 1;
  }
  __assert_fail("validUses[i] <= uses[i]",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/TupleOptimization.cpp"
                ,0xa9,"void wasm::TupleOptimization::optimize(Function *)");
}

Assistant:

void optimize(Function* func) {
    auto numLocals = func->getNumLocals();

    // Find the set of bad indexes. We add each such candidate to a worklist
    // that we will then flow to find all those corrupted.
    std::vector<bool> bad(numLocals);
    UniqueDeferredQueue<Index> work;

    for (Index i = 0; i < uses.size(); i++) {
      assert(validUses[i] <= uses[i]);
      if (uses[i] > 0 && validUses[i] < uses[i]) {
        // This is a bad tuple.
        work.push(i);
      }
    }

    // Flow badness forward.
    while (!work.empty()) {
      auto i = work.pop();
      if (bad[i]) {
        continue;
      }
      bad[i] = true;
      for (auto target : copiedIndexes[i]) {
        work.push(target);
      }
    }

    // Good indexes we can optimize are tuple locals with uses that are not bad.
    std::vector<bool> good(numLocals);
    bool hasGood = false;
    for (Index i = 0; i < uses.size(); i++) {
      if (uses[i] > 0 && !bad[i]) {
        good[i] = true;
        hasGood = true;
      }
    }

    if (!hasGood) {
      return;
    }

    // We found things to optimize! Create new non-tuple locals for their
    // contents, and then rewrite the code to use those according to the
    // mapping from tuple locals to normal ones. The mapping maps a tuple local
    // to the base index used for its contents: an index and several others
    // right after it, depending on the tuple size.
    std::unordered_map<Index, Index> tupleToNewBaseMap;
    for (Index i = 0; i < good.size(); i++) {
      if (!good[i]) {
        continue;
      }

      auto newBase = func->getNumLocals();
      tupleToNewBaseMap[i] = newBase;
      Index lastNewIndex = 0;
      for (auto t : func->getLocalType(i)) {
        Index newIndex = Builder::addVar(func, t);
        if (lastNewIndex == 0) {
          // This is the first new local we added (0 is an impossible value,
          // since tuple locals exist, hence index 0 was already taken), so it
          // must be equal to the base.
          assert(newIndex == newBase);
        } else {
          // This must be right after the former.
          assert(newIndex == lastNewIndex + 1);
        }
        lastNewIndex = newIndex;
      }
    }

    MapApplier mapApplier(tupleToNewBaseMap);
    mapApplier.walkFunctionInModule(func, getModule());
  }